

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O0

void dasm_put(BuildCtx *ctx,int start,...)

{
  int iVar1;
  char in_AL;
  byte bVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  undefined8 in_RCX;
  dasm_Section *pdVar6;
  dasm_Section *pdVar7;
  undefined8 in_RDX;
  int iVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_1b8;
  int *local_198;
  uint *local_160;
  uint local_148 [4];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  int *pb;
  int *piStack_88;
  int n_1;
  int *pl;
  int n;
  int action;
  size_t _need;
  size_t _sz;
  int *b;
  int local_58;
  int mrm;
  int ofs;
  int pos;
  dasm_Section *sec;
  dasm_ActList p;
  dasm_State *D;
  va_list ap;
  int start_local;
  BuildCtx *ctx_local;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  p = (dasm_ActList)ctx->D;
  sec = (dasm_Section *)(((dasm_State *)p)->actionlist + start);
  _ofs = ((dasm_State *)p)->section;
  mrm = _ofs->pos;
  local_58 = _ofs->ofs;
  b._4_4_ = 0xffffffff;
  if (_ofs->epos <= mrm) {
    _need = _ofs->bsize;
    _n = _ofs->bsize + 200;
    if (_need < _n) {
      if (_need < 0x10) {
        _need = 0x10;
      }
      for (; _need < _n; _need = _need * 2) {
      }
      local_138 = in_RDX;
      local_130 = in_RCX;
      local_128 = in_R8;
      local_120 = in_R9;
      piVar4 = (int *)realloc(_ofs->buf,_need);
      _ofs->buf = piVar4;
      if (_ofs->buf == (int *)0x0) {
        exit(1);
      }
      _ofs->bsize = _need;
    }
    _ofs->rbuf = _ofs->buf + -(ulong)(mrm & 0xff000000);
    _ofs->epos = (int)((ulong)(long)(int)_ofs->bsize >> 2) + -0x19 + (mrm & 0xff000000U);
  }
  piVar4 = _ofs->rbuf;
  piVar4[mrm] = start;
  ap[0]._0_8_ = &stack0x00000008;
  D._0_4_ = 0x10;
  iVar8 = mrm + 1;
  pdVar6 = sec;
switchD_00105d10_default:
  while( true ) {
    sec = pdVar6;
    mrm = iVar8;
    pdVar6 = (dasm_Section *)((long)&sec->rbuf + 1);
    bVar2 = *(byte *)&sec->rbuf;
    iVar8 = mrm;
    if (0xe8 < bVar2) break;
    local_58 = local_58 + 1;
  }
  iVar1 = (int)pdVar6;
  if (0xf3 < bVar2) goto code_r0x00105cfb;
  if ((uint)D < 0x29) {
    local_160 = (uint *)((long)local_148 + (long)(int)(uint)D);
    D._0_4_ = (uint)D + 8;
  }
  else {
    local_160 = (uint *)ap[0]._0_8_;
    ap[0]._0_8_ = ap[0]._0_8_ + 8;
  }
  pl._0_4_ = *local_160;
  iVar8 = mrm + 1;
  piVar4[mrm] = (uint)pl;
  switch(bVar2) {
  case 0xe9:
    if ((uint)pl == 0) {
      if ((int)b._4_4_ < 0) {
        b._4_4_ = (uint)(byte)sec[-1].field_0x27;
      }
      if ((b._4_4_ & 7) != 5) break;
    }
  case 0xef:
    if (((uint)pl + 0x80 & 0xffffff00) == 0) goto LAB_00105b16;
switchD_00105a49_caseD_ed:
    local_58 = local_58 + 4;
    break;
  case 0xea:
    if (((uint)pl + 0x80 & 0xffffff00) != 0) {
      *(uint *)(p + 0x4c) = (iVar1 - (int)*(undefined8 *)(p + 8)) - 1U | 0x11000000;
      return;
    }
    goto LAB_00105b16;
  case 0xeb:
    if (((uint)pl & 0xffffff00) != 0) {
      *(uint *)(p + 0x4c) = (iVar1 - (int)*(undefined8 *)(p + 8)) - 1U | 0x11000000;
      return;
    }
    goto LAB_00105b16;
  case 0xec:
LAB_00105b3c:
    if (((uint)pl & 0xffff0000) != 0) {
      *(uint *)(p + 0x4c) = (iVar1 - (int)*(undefined8 *)(p + 8)) - 1U | 0x11000000;
      return;
    }
    local_58 = local_58 + 2;
    break;
  case 0xed:
  case 0xf3:
    goto switchD_00105a49_caseD_ed;
  case 0xee:
    if (((uint)pl + 0x80 & 0xffffff00) != 0) goto LAB_00105b3c;
LAB_00105b16:
    local_58 = local_58 + 1;
    break;
  case 0xf0:
    if ((((uint)pl & 0xfffffff0) != 0) ||
       (((uint)pl == 4 && ((int)(uint)*(byte *)&pdVar6->rbuf >> 5 == 2)))) {
      *(uint *)(p + 0x4c) = (iVar1 - (int)*(undefined8 *)(p + 8)) - 1U | 0x15000000;
      return;
    }
    if ((*(byte *)&pdVar6->rbuf < 0x40) && (*(char *)((long)&sec->rbuf + 2) == -0x17)) {
      b._4_4_ = (uint)pl;
    }
    if ((*(byte *)&pdVar6->rbuf < 0x20) && (((uint)pl & 7) == 4)) {
      local_58 = local_58 + 1;
    }
    pdVar7 = (dasm_Section *)((long)&sec->rbuf + 2);
    bVar2 = *(byte *)&pdVar6->rbuf >> 3 & 3;
    if (bVar2 != 1) {
      if (bVar2 != 2) {
        pdVar6 = pdVar7;
        if (bVar2 != 3) goto switchD_00105d10_default;
        pl._0_4_ = piVar4[mrm + -2] | (uint)pl;
      }
      pl._0_4_ = piVar4[mrm + -1] | (uint)pl;
    }
    pdVar6 = pdVar7;
    if ((int)(uint)pl < 8) {
      piVar4[mrm] = piVar4[mrm] | 0x10;
      local_58 = local_58 + -1;
    }
    goto switchD_00105d10_default;
  case 0xf1:
    local_58 = (uint)pl + local_58;
    pdVar6 = (dasm_Section *)((long)&sec->rbuf + 2);
    break;
  case 0xf2:
    piVar4[mrm + -1] = -0x40000000;
  }
  sec = pdVar6;
  b._4_4_ = 0xffffffff;
  pdVar6 = sec;
  goto switchD_00105d10_default;
code_r0x00105cfb:
  switch(bVar2) {
  case 0xf4:
  case 0xf6:
    sec = (dasm_Section *)((long)&sec->rbuf + 2);
    uVar3 = (uint)*(byte *)&pdVar6->rbuf;
    piStack_88 = (int *)(*(long *)(p + 0x10) + (long)(int)uVar3 * 4);
    if (uVar3 < 0xf7) {
      if ((uVar3 < 10) && (-1 < *piStack_88)) {
        *(uint *)(p + 0x4c) = ((int)sec - (int)*(undefined8 *)(p + 8)) - 1U | 0x13000000;
        return;
      }
      if (*(ulong *)(p + 0x18) <= (ulong)((long)piStack_88 - *(long *)(p + 0x10))) {
        *(uint *)(p + 0x4c) = ((int)sec - (int)*(undefined8 *)(p + 8)) - 1U | 0x13000000;
        return;
      }
      goto LAB_00105ed3;
    }
    piStack_88 = piStack_88 + -0xf6;
    pb._4_4_ = *piStack_88;
    if (pb._4_4_ < 0) {
      pb._4_4_ = 0;
    }
    break;
  case 0xf5:
  case 0xf7:
    if ((uint)D < 0x29) {
      local_198 = (int *)((long)local_148 + (long)(int)(uint)D);
      D._0_4_ = (uint)D + 8;
    }
    else {
      local_198 = (int *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    piStack_88 = (int *)(*(long *)(p + 0x20) + (long)*local_198 * 4);
    sec = pdVar6;
    if (*(ulong *)(p + 0x28) <= (ulong)((long)piStack_88 - *(long *)(p + 0x20))) {
      *(uint *)(p + 0x4c) = (iVar1 - (int)*(undefined8 *)(p + 8)) - 1U | 0x14000000;
      return;
    }
LAB_00105ed3:
    pb._4_4_ = *piStack_88;
    if (pb._4_4_ < 0) {
      piVar4[mrm] = -pb._4_4_;
      goto LAB_00105f19;
    }
    break;
  case 0xf8:
    sec = (dasm_Section *)((long)&sec->rbuf + 2);
    piStack_88 = (int *)(*(long *)(p + 0x10) + (long)(int)(uint)*(byte *)&pdVar6->rbuf * 4);
    if (*(ulong *)(p + 0x18) <= (ulong)((long)piStack_88 - *(long *)(p + 0x10))) {
      *(uint *)(p + 0x4c) = ((int)sec - (int)*(undefined8 *)(p + 8)) - 1U | 0x13000000;
      return;
    }
    goto LAB_0010609b;
  case 0xf9:
    if ((uint)D < 0x29) {
      local_1b8 = (int *)((long)local_148 + (long)(int)(uint)D);
      D._0_4_ = (uint)D + 8;
    }
    else {
      local_1b8 = (int *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    piStack_88 = (int *)(*(long *)(p + 0x20) + (long)*local_1b8 * 4);
    sec = pdVar6;
    if (*(ulong *)(p + 0x28) <= (ulong)((long)piStack_88 - *(long *)(p + 0x20))) {
      *(uint *)(p + 0x4c) = (iVar1 - (int)*(undefined8 *)(p + 8)) - 1U | 0x14000000;
      return;
    }
LAB_0010609b:
    pb._4_4_ = *piStack_88;
    while (0 < pb._4_4_) {
      piVar5 = (int *)(*(long *)(p + (long)(pb._4_4_ >> 0x18) * 0x28 + 0x50) + (long)pb._4_4_ * 4);
      pb._4_4_ = *piVar5;
      *piVar5 = mrm;
    }
    *piStack_88 = -mrm;
    piVar4[mrm] = local_58;
    iVar8 = mrm + 1;
    pdVar6 = sec;
    goto switchD_00105d10_default;
  case 0xfa:
    local_58 = (uint)*(byte *)&pdVar6->rbuf + local_58;
    piVar4[mrm] = local_58;
    iVar8 = mrm + 1;
    pdVar6 = (dasm_Section *)((long)&sec->rbuf + 2);
    goto switchD_00105d10_default;
  case 0xfb:
    local_58 = local_58 + 4;
    pdVar6 = (dasm_Section *)((long)&sec->rbuf + 3);
    goto switchD_00105d10_default;
  case 0xfc:
    local_58 = local_58 + 1;
    pdVar6 = (dasm_Section *)((long)&sec->rbuf + 2);
    goto switchD_00105d10_default;
  case 0xfd:
    b._4_4_ = (uint)(byte)sec[-1].field_0x27;
    goto switchD_00105d10_default;
  case 0xfe:
    goto switchD_00105d10_caseD_fe;
  case 0xff:
    goto LAB_00106206;
  default:
    goto switchD_00105d10_default;
  }
  piVar4[mrm] = pb._4_4_;
  *piStack_88 = mrm;
LAB_00105f19:
  if ((bVar2 == 0xf4) || (bVar2 == 0xf5)) {
    piVar4[mrm + 1] = local_58 + 4;
    local_58 = local_58 + 4;
    iVar8 = mrm + 2;
    pdVar6 = sec;
  }
  else {
    local_58 = local_58 + 8;
    iVar8 = mrm + 1;
    pdVar6 = sec;
  }
  goto switchD_00105d10_default;
switchD_00105d10_caseD_fe:
  if ((int)(uint)*(byte *)&pdVar6->rbuf < *(int *)(p + 0x48)) {
    *(dasm_ActList *)(p + 0x38) = p + (long)(int)(uint)*(byte *)&pdVar6->rbuf * 0x28 + 0x50;
LAB_00106206:
    _ofs->pos = mrm;
    _ofs->ofs = local_58;
  }
  else {
    *(uint *)(p + 0x4c) = (iVar1 - (int)*(undefined8 *)(p + 8)) - 1U | 0x12000000;
  }
  return;
}

Assistant:

void dasm_put(Dst_DECL, int start, ...)
{
  va_list ap;
  dasm_State *D = Dst_REF;
  dasm_ActList p = D->actionlist + start;
  dasm_Section *sec = D->section;
  int pos = sec->pos, ofs = sec->ofs, mrm = -1;
  int *b;

  if (pos >= sec->epos) {
    DASM_M_GROW(Dst, int, sec->buf, sec->bsize,
      sec->bsize + 2*DASM_MAXSECPOS*sizeof(int));
    sec->rbuf = sec->buf - DASM_POS2BIAS(pos);
    sec->epos = (int)sec->bsize/sizeof(int) - DASM_MAXSECPOS+DASM_POS2BIAS(pos);
  }

  b = sec->rbuf;
  b[pos++] = start;

  va_start(ap, start);
  while (1) {
    int action = *p++;
    if (action < DASM_DISP) {
      ofs++;
    } else if (action <= DASM_REL_A) {
      int n = va_arg(ap, int);
      b[pos++] = n;
      switch (action) {
      case DASM_DISP:
	if (n == 0) { if (mrm < 0) mrm = p[-2]; if ((mrm&7) != 5) break; }
	/* fallthrough */
      case DASM_IMM_DB: if (((n+128)&-256) == 0) goto ob; /* fallthrough */
      case DASM_REL_A: /* Assumes ptrdiff_t is int. !x64 */
      case DASM_IMM_D: ofs += 4; break;
      case DASM_IMM_S: CK(((n+128)&-256) == 0, RANGE_I); goto ob;
      case DASM_IMM_B: CK((n&-256) == 0, RANGE_I); ob: ofs++; break;
      case DASM_IMM_WB: if (((n+128)&-256) == 0) goto ob; /* fallthrough */
      case DASM_IMM_W: CK((n&-65536) == 0, RANGE_I); ofs += 2; break;
      case DASM_SPACE: p++; ofs += n; break;
      case DASM_SETLABEL: b[pos-2] = -0x40000000; break;  /* Neg. label ofs. */
      case DASM_VREG: CK((n&-16) == 0 && (n != 4 || (*p>>5) != 2), RANGE_VREG);
	if (*p < 0x40 && p[1] == DASM_DISP) mrm = n;
	if (*p < 0x20 && (n&7) == 4) ofs++;
	switch ((*p++ >> 3) & 3) {
	case 3: n |= b[pos-3]; /* fallthrough */
	case 2: n |= b[pos-2]; /* fallthrough */
	case 1: if (n <= 7) { b[pos-1] |= 0x10; ofs--; }
	}
	continue;
      }
      mrm = -1;
    } else {
      int *pl, n;
      switch (action) {
      case DASM_REL_LG:
      case DASM_IMM_LG:
	n = *p++; pl = D->lglabels + n;
	/* Bkwd rel or global. */
	if (n <= 246) { CK(n>=10||*pl<0, RANGE_LG); CKPL(lg, LG); goto putrel; }
	pl -= 246; n = *pl;
	if (n < 0) n = 0;  /* Start new chain for fwd rel if label exists. */
	goto linkrel;
      case DASM_REL_PC:
      case DASM_IMM_PC: pl = D->pclabels + va_arg(ap, int); CKPL(pc, PC);
      putrel:
	n = *pl;
	if (n < 0) {  /* Label exists. Get label pos and store it. */
	  b[pos] = -n;
	} else {
      linkrel:
	  b[pos] = n;  /* Else link to rel chain, anchored at label. */
	  *pl = pos;
	}
	pos++;
	ofs += 4;  /* Maximum offset needed. */
	if (action == DASM_REL_LG || action == DASM_REL_PC) {
	  b[pos++] = ofs;  /* Store pass1 offset estimate. */
	} else if (sizeof(ptrdiff_t) == 8) {
	  ofs += 4;
	}
	break;
      case DASM_LABEL_LG: pl = D->lglabels + *p++; CKPL(lg, LG); goto putlabel;
      case DASM_LABEL_PC: pl = D->pclabels + va_arg(ap, int); CKPL(pc, PC);
      putlabel:
	n = *pl;  /* n > 0: Collapse rel chain and replace with label pos. */
	while (n > 0) { int *pb = DASM_POS2PTR(D, n); n = *pb; *pb = pos; }
	*pl = -pos;  /* Label exists now. */
	b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_ALIGN:
	ofs += *p++;  /* Maximum alignment needed (arg is 2**n-1). */
	b[pos++] = ofs;  /* Store pass1 offset estimate. */
	break;
      case DASM_EXTERN: p += 2; ofs += 4; break;
      case DASM_ESC: p++; ofs++; break;
      case DASM_MARK: mrm = p[-2]; break;
      case DASM_SECTION:
	n = *p; CK(n < D->maxsection, RANGE_SEC); D->section = &D->sections[n];
      case DASM_STOP: goto stop;
      }
    }
  }
stop:
  va_end(ap);
  sec->pos = pos;
  sec->ofs = ofs;
}